

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglpaintengine.cpp
# Opt level: O3

void __thiscall
QOpenGL2PaintEngineExPrivate::composite
          (QOpenGL2PaintEngineExPrivate *this,QOpenGLRect *boundingRect)

{
  socklen_t in_ECX;
  sockaddr *in_RDX;
  
  this->staticVertexCoordinateArray[0] = boundingRect->left;
  this->staticVertexCoordinateArray[1] = boundingRect->top;
  this->staticVertexCoordinateArray[2] = boundingRect->right;
  this->staticVertexCoordinateArray[3] = boundingRect->top;
  this->staticVertexCoordinateArray[4] = boundingRect->right;
  this->staticVertexCoordinateArray[5] = boundingRect->bottom;
  this->staticVertexCoordinateArray[6] = boundingRect->left;
  this->staticVertexCoordinateArray[7] = boundingRect->bottom;
  QOpenGLBuffer::bind(&this->vertexBuffer,(int)boundingRect,in_RDX,in_ECX);
  QOpenGLBuffer::allocate(&this->vertexBuffer,this->staticVertexCoordinateArray,0x20);
  (**(code **)(*(long *)&this->funcs + 0x468))(0,2,0x1406,0,0,0);
  (**(code **)(*(long *)&this->funcs + 0x78))(6,0,4);
  return;
}

Assistant:

void QOpenGL2PaintEngineExPrivate::composite(const QOpenGLRect& boundingRect)
{
    setCoords(staticVertexCoordinateArray, boundingRect);

    uploadData(QT_VERTEX_COORDS_ATTR, staticVertexCoordinateArray, 8);
    funcs.glDrawArrays(GL_TRIANGLE_FAN, 0, 4);
}